

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptArray::DeleteProperty
          (JavascriptArray *this,JavascriptString *propertyNameString,PropertyOperationFlags flags)

{
  bool bVar1;
  BOOL BVar2;
  
  bVar1 = BuiltInPropertyRecord<7>::Equals
                    ((BuiltInPropertyRecord<7> *)BuiltInPropertyRecords::length,propertyNameString);
  if (bVar1) {
    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
              (flags,(((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.
                        ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                     ptr,(PCWSTR)(BuiltInPropertyRecords::length + 0x18));
    return 0;
  }
  BVar2 = DynamicObject::DeleteProperty((DynamicObject *)this,propertyNameString,flags);
  return BVar2;
}

Assistant:

BOOL JavascriptArray::DeleteProperty(JavascriptString *propertyNameString, PropertyOperationFlags flags)
    {
        if (BuiltInPropertyRecords::length.Equals(propertyNameString))
        {
            JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                flags, GetScriptContext(), BuiltInPropertyRecords::length.buffer);

            return false;
        }
        return DynamicObject::DeleteProperty(propertyNameString, flags);
    }